

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

double __thiscall r_exec::Group::update_act(Group *this,View *v)

{
  uint16_t uVar1;
  uint uVar2;
  _Mem *p_Var3;
  View *pVVar4;
  Group *pGVar5;
  Code *pCVar6;
  _Mem *p_Var7;
  Code *pCVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float local_94;
  float local_54;
  ushort local_38;
  uint16_t i_1;
  uint16_t ntf_grp_count_1;
  ushort local_24;
  uint16_t i;
  uint16_t ntf_grp_count;
  double act;
  View *v_local;
  Group *this_local;
  
  fVar9 = get_low_act_thr(this);
  fVar10 = get_high_act_thr(this);
  dVar11 = View::update_act(v,(double)fVar9,(double)fVar10);
  this->avg_act = dVar11 + this->avg_act;
  if (dVar11 < this->high_act || dVar11 == this->high_act) {
    if (dVar11 < this->low_act) {
      this->low_act = dVar11;
    }
  }
  else {
    this->high_act = dVar11;
  }
  this->act_updates = this->act_updates + 1;
  uVar2 = (*(v->super_View).super__Object._vptr__Object[2])();
  if ((uVar2 & 1) == 0) {
    local_54 = (float)v->periods_at_high_act;
    fVar9 = get_act_ntf_prd(this);
    if ((local_54 != fVar9) || (NAN(local_54) || NAN(fVar9))) {
      local_94 = (float)v->periods_at_low_act;
      fVar9 = get_act_ntf_prd(this);
      if ((local_94 == fVar9) && (!NAN(local_94) && !NAN(fVar9))) {
        v->periods_at_low_act = 0;
        uVar1 = get_ntf_grp_count(this);
        for (local_38 = 1; local_38 <= uVar1; local_38 = local_38 + 1) {
          p_Var3 = _Mem::Get();
          pVVar4 = (View *)operator_new(0x100);
          pGVar5 = get_ntf_grp(this,local_38);
          pCVar6 = (Code *)operator_new(0x150);
          p_Var7 = _Mem::Get();
          pCVar8 = core::P::operator_cast_to_Code_((P *)&(v->super_View).object);
          MkLowAct::MkLowAct((MkLowAct *)pCVar6,&p_Var7->super_Mem,pCVar8);
          NotificationView::NotificationView
                    ((NotificationView *)pVVar4,(Code *)this,(Code *)pGVar5,pCVar6);
          _Mem::inject_notification(p_Var3,pVVar4,false);
        }
      }
    }
    else {
      v->periods_at_high_act = 0;
      uVar1 = get_ntf_grp_count(this);
      for (local_24 = 1; local_24 <= uVar1; local_24 = local_24 + 1) {
        p_Var3 = _Mem::Get();
        pVVar4 = (View *)operator_new(0x100);
        pGVar5 = get_ntf_grp(this,local_24);
        pCVar6 = (Code *)operator_new(0x150);
        p_Var7 = _Mem::Get();
        pCVar8 = core::P::operator_cast_to_Code_((P *)&(v->super_View).object);
        MkHighAct::MkHighAct((MkHighAct *)pCVar6,&p_Var7->super_Mem,pCVar8);
        NotificationView::NotificationView
                  ((NotificationView *)pVVar4,(Code *)this,(Code *)pGVar5,pCVar6);
        _Mem::inject_notification(p_Var3,pVVar4,false);
      }
    }
  }
  return dVar11;
}

Assistant:

double Group::update_act(View *v)
{
    double act = v->update_act(get_low_act_thr(), get_high_act_thr());
    avg_act += act;

    if (act > high_act) {
        high_act = act;
    } else if (act < low_act) {
        low_act = act;
    }

    ++act_updates;

    if (!v->isNotification()) {
        if (v->periods_at_high_act == get_act_ntf_prd()) {
            v->periods_at_high_act = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkHighAct(_Mem::Get(), v->object)), false);
            }
        } else if (v->periods_at_low_act == get_act_ntf_prd()) {
            v->periods_at_low_act = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowAct(_Mem::Get(), v->object)), false);
            }
        }
    }

    return act;
}